

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(short lhs,
         SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  bool bVar2;
  int iVar3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_ESI;
  short in_DI;
  short ret;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  short *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  undefined2 uVar4;
  undefined2 uVar5;
  short lhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff4;
  int local_4;
  
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )&stack0xfffffffffffffff0);
  uVar5 = (undefined2)in_ESI.m_int;
  lhs_00 = (short)((uint)in_ESI.m_int >> 0x10);
  bVar2 = DivisionCornerCaseHelper<int,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_DI,in_ESI,
                     (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff0);
  SVar1.m_int = in_stack_fffffffffffffff0.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<int,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
              ::DivisionCornerCase2
                        (lhs_00,in_stack_fffffffffffffff0,
                         (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT26(in_stack_ffffffffffffffe6,
                                     CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)))
     , SVar1.m_int = in_stack_fffffffffffffff0.m_int, !bVar2)) {
    uVar4 = 0;
    iVar3 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)(ulong)CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    DivisionHelper<short,int,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((short *)CONCAT26(in_DI,CONCAT24(in_stack_fffffffffffffff4,
                                                in_stack_fffffffffffffff0.m_int)),
               (int *)CONCAT26(lhs_00,CONCAT24(uVar5,in_ESI.m_int)),
               (short *)CONCAT26(uVar4,CONCAT24(in_stack_ffffffffffffffe4,iVar3)));
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<short>((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(uVar4,CONCAT24(in_stack_ffffffffffffffe4,iVar3)),
                   in_stack_ffffffffffffffd8);
    SVar1.m_int = local_4;
  }
  local_4 = SVar1.m_int;
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}